

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O1

void __thiscall pbrt::semantic::PBRTInfo::traverse(PBRTInfo *this,SP *object)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  element_type *peVar3;
  _Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
  *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer psVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer psVar8;
  element_type *peVar9;
  _func_int **pp_Var10;
  _Base_ptr p_Var11;
  long lVar12;
  ostream *poVar13;
  _Base_ptr p_Var14;
  pointer psVar15;
  iterator __begin2;
  _Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
  *p_Var16;
  pointer psVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  Entity local_78;
  _Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
  *local_58;
  SP *local_50;
  SP local_48;
  pointer local_38;
  
  p_Var14 = (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header;
  p_Var11 = &p_Var2->_M_header;
  if (p_Var14 != (_Base_ptr)0x0) {
    do {
      bVar18 = *(element_type **)(p_Var14 + 1) <
               (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (!bVar18) {
        p_Var11 = p_Var14;
      }
      p_Var14 = (&p_Var14->_M_left)[bVar18];
    } while (p_Var14 != (_Base_ptr)0x0);
  }
  p_Var14 = &p_Var2->_M_header;
  if (((_Rb_tree_header *)p_Var11 != p_Var2) &&
     (p_Var14 = p_Var11,
     (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr <
     *(element_type **)(p_Var11 + 1))) {
    p_Var14 = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::shared_ptr<pbrt::Object>,std::shared_ptr<pbrt::Object>,std::_Identity<std::shared_ptr<pbrt::Object>>,std::less<std::shared_ptr<pbrt::Object>>,std::allocator<std::shared_ptr<pbrt::Object>>>
  ::_M_insert_unique<std::shared_ptr<pbrt::Object>const&>
            ((_Rb_tree<std::shared_ptr<pbrt::Object>,std::shared_ptr<pbrt::Object>,std::_Identity<std::shared_ptr<pbrt::Object>>,std::less<std::shared_ptr<pbrt::Object>>,std::allocator<std::shared_ptr<pbrt::Object>>>
              *)&this->alreadyTraversed,object);
  psVar1 = &(this->numObjects).instanced;
  *psVar1 = *psVar1 + 1;
  if ((_Rb_tree_header *)p_Var14 == p_Var2) {
    (this->numObjects).unique = (this->numObjects).unique + 1;
  }
  peVar3 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var16 = (_Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
             *)(peVar3->lightSources).
               super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (_Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
            *)(peVar3->lightSources).
              super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)p_Var4 - (long)p_Var16 >> 4;
  psVar1 = &(this->numLights).instanced;
  *psVar1 = *psVar1 + lVar12;
  if ((_Rb_tree_header *)p_Var14 == p_Var2) {
    (this->numLights).unique = (this->numLights).unique + lVar12;
  }
  local_50 = object;
  if (p_Var16 != p_Var4) {
    do {
      local_58 = p_Var4;
      this_00._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var16 + 8);
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        }
      }
      Entity::as<pbrt::PointLightSource>(&local_78);
      pp_Var10 = local_78._vptr_Entity;
      if (local_78.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((pp_Var10 != (_func_int **)0x0) &&
         (psVar1 = &(this->numPointLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var14 == p_Var2)) {
        (this->numPointLights).unique = (this->numPointLights).unique + 1;
      }
      Entity::as<pbrt::SpotLightSource>(&local_78);
      pp_Var10 = local_78._vptr_Entity;
      if (local_78.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((pp_Var10 != (_func_int **)0x0) &&
         (psVar1 = &(this->numSpotLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var14 == p_Var2)) {
        (this->numSpotLights).unique = (this->numSpotLights).unique + 1;
      }
      Entity::as<pbrt::InfiniteLightSource>(&local_78);
      pp_Var10 = local_78._vptr_Entity;
      if (local_78.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((pp_Var10 != (_func_int **)0x0) &&
         (psVar1 = &(this->numInfiniteLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var14 == p_Var2)) {
        (this->numInfiniteLights).unique = (this->numInfiniteLights).unique + 1;
      }
      Entity::as<pbrt::DistantLightSource>(&local_78);
      pp_Var10 = local_78._vptr_Entity;
      if (local_78.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((pp_Var10 != (_func_int **)0x0) &&
         (psVar1 = &(this->numDistantLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var14 == p_Var2)) {
        (this->numDistantLights).unique = (this->numDistantLights).unique + 1;
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      p_Var16 = p_Var16 + 0x10;
      p_Var4 = local_58;
    } while (p_Var16 != local_58);
  }
  peVar3 = (local_50->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar17 = (peVar3->shapes).
            super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (peVar3->shapes).
           super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)psVar5 - (long)psVar17 >> 4;
  psVar1 = &(this->numShapes).instanced;
  *psVar1 = *psVar1 + lVar12;
  if ((_Rb_tree_header *)p_Var14 == p_Var2) {
    (this->numShapes).unique = (this->numShapes).unique + lVar12;
  }
  if (psVar17 != psVar5) {
    local_58 = (_Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
                *)&this->usedMaterials;
    local_38 = psVar5;
    do {
      peVar6 = (psVar17->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var7 = (psVar17->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
      ::_M_insert_unique<std::shared_ptr<pbrt::Material>const&>(local_58,&peVar6->material);
      if (((peVar6->areaLight).super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) &&
         (psVar1 = &(this->numAreaLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var14 == p_Var2)) {
        (this->numAreaLights).unique = (this->numAreaLights).unique + 1;
      }
      if (peVar6 == (element_type *)0x0) {
        lVar12 = 0;
      }
      else {
        lVar12 = __dynamic_cast(peVar6,&Shape::typeinfo,&TriangleMesh::typeinfo,0);
      }
      this_01 = p_Var7;
      if (lVar12 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (lVar12 != 0 && p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
          this_01 = p_Var7;
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          this_01 = p_Var7;
        }
      }
      if (lVar12 == 0) {
        if (peVar6 == (element_type *)0x0) {
          lVar12 = 0;
        }
        else {
          lVar12 = __dynamic_cast(peVar6,&Shape::typeinfo,&QuadMesh::typeinfo,0);
        }
        local_80 = p_Var7;
        if (lVar12 == 0) {
          local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (lVar12 != 0 && p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
            local_80 = p_Var7;
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            local_80 = p_Var7;
          }
        }
        if (lVar12 == 0) {
          if (peVar6 == (element_type *)0x0) {
            bVar18 = true;
          }
          else {
            lVar12 = __dynamic_cast(peVar6,&Shape::typeinfo,&Sphere::typeinfo,0);
            bVar18 = lVar12 == 0;
          }
          local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (!bVar18) {
            local_88 = p_Var7;
          }
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && !bVar18) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
              local_88 = p_Var7;
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              local_88 = p_Var7;
            }
          }
          if (bVar18) {
            if (peVar6 == (element_type *)0x0) {
              bVar18 = true;
            }
            else {
              lVar12 = __dynamic_cast(peVar6,&Shape::typeinfo,&Disk::typeinfo,0);
              bVar18 = lVar12 == 0;
            }
            local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (!bVar18) {
              local_90 = p_Var7;
            }
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && !bVar18) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                UNLOCK();
                local_90 = p_Var7;
              }
              else {
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                local_90 = p_Var7;
              }
            }
            if (bVar18) {
              if (peVar6 == (element_type *)0x0) {
                bVar18 = true;
              }
              else {
                lVar12 = __dynamic_cast(peVar6,&Shape::typeinfo,&Curve::typeinfo,0);
                bVar18 = lVar12 == 0;
              }
              local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (!bVar18) {
                local_98 = p_Var7;
              }
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && !bVar18) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  UNLOCK();
                  local_98 = p_Var7;
                }
                else {
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  local_98 = p_Var7;
                }
              }
              if (bVar18) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"un-handled geometry type : ",0x1b);
                (**(peVar6->super_Entity)._vptr_Entity)(&local_78,peVar6);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_78._vptr_Entity,
                                     (long)local_78.super_enable_shared_from_this<pbrt::Entity>.
                                           _M_weak_this.
                                           super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                if ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)local_78._vptr_Entity !=
                    &local_78.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                     super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
                  operator_delete(local_78._vptr_Entity);
                }
              }
              else {
                psVar1 = &(this->numCurves).instanced;
                *psVar1 = *psVar1 + 1;
                if ((_Rb_tree_header *)p_Var14 == p_Var2) {
                  (this->numCurves).unique = (this->numCurves).unique + 1;
                }
              }
              if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
              }
            }
            else {
              psVar1 = &(this->numDisks).instanced;
              *psVar1 = *psVar1 + 1;
              if ((_Rb_tree_header *)p_Var14 == p_Var2) {
                (this->numDisks).unique = (this->numDisks).unique + 1;
              }
            }
            if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
            }
          }
          else {
            psVar1 = &(this->numSpheres).instanced;
            *psVar1 = *psVar1 + 1;
            if ((_Rb_tree_header *)p_Var14 == p_Var2) {
              (this->numSpheres).unique = (this->numSpheres).unique + 1;
            }
          }
          if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
          }
        }
        else {
          lVar12 = *(long *)(lVar12 + 0xa8) - *(long *)(lVar12 + 0xa0) >> 4;
          psVar1 = &(this->numQuads).instanced;
          *psVar1 = *psVar1 + lVar12;
          if ((_Rb_tree_header *)p_Var14 == p_Var2) {
            (this->numQuads).unique = (this->numQuads).unique + lVar12;
          }
        }
        if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
        }
      }
      else {
        lVar12 = (*(long *)(lVar12 + 0xc0) - *(long *)(lVar12 + 0xb8) >> 2) * -0x5555555555555555;
        psVar1 = &(this->numTriangles).instanced;
        *psVar1 = *psVar1 + lVar12;
        if ((_Rb_tree_header *)p_Var14 == p_Var2) {
          (this->numTriangles).unique = (this->numTriangles).unique + lVar12;
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      psVar17 = psVar17 + 1;
    } while (psVar17 != local_38);
  }
  peVar3 = (local_50->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar15 = (peVar3->instances).
            super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar8 = (peVar3->instances).
           super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)psVar8 - (long)psVar15 >> 4;
  psVar1 = &(this->numInstances).instanced;
  *psVar1 = *psVar1 + lVar12;
  if ((_Rb_tree_header *)p_Var14 == p_Var2) {
    (this->numInstances).unique = (this->numInstances).unique + lVar12;
  }
  if (psVar15 != psVar8) {
    do {
      peVar9 = (psVar15->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var7 = (psVar15->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (peVar9->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (peVar9->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      traverse(this,&local_48);
      if (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      psVar15 = psVar15 + 1;
    } while (psVar15 != psVar8);
  }
  return;
}

Assistant:

void traverse(Object::SP object)
      {
        const bool firstTime = (alreadyTraversed.find(object) == alreadyTraversed.end());
        alreadyTraversed.insert(object);
 
        numObjects.add(firstTime,1);
        numLights.add(firstTime,object->lightSources.size());

        for (auto light : object->lightSources) {
          if (light->as<PointLightSource>())
            numPointLights.add(firstTime,1);
          if (light->as<SpotLightSource>())
            numSpotLights.add(firstTime,1);
          if (light->as<InfiniteLightSource>())
            numInfiniteLights.add(firstTime,1);
          if (light->as<DistantLightSource>())
            numDistantLights.add(firstTime,1);
        }
        
        numShapes.add(firstTime,object->shapes.size());
        
        for (auto shape : object->shapes) {
          usedMaterials.insert(shape->material);
          if (shape->areaLight) {
            numAreaLights.add(firstTime,1);
          }
          if (TriangleMesh::SP mesh=std::dynamic_pointer_cast<TriangleMesh>(shape)){
            numTriangles.add(firstTime,mesh->index.size());
          } else if (QuadMesh::SP mesh=std::dynamic_pointer_cast<QuadMesh>(shape)){
            numQuads.add(firstTime,mesh->index.size());
          } else if (Sphere::SP sphere=std::dynamic_pointer_cast<Sphere>(shape)){
            numSpheres.add(firstTime,1);
          } else if (Disk::SP disk=std::dynamic_pointer_cast<Disk>(shape)){
            numDisks.add(firstTime,1);
          } else if (Curve::SP curves=std::dynamic_pointer_cast<Curve>(shape)){
            numCurves.add(firstTime,1);
          } else
            std::cout << "un-handled geometry type : " << shape->toString() << std::endl;
        }

        numInstances.add(firstTime,object->instances.size());
        for (auto inst : object->instances) {
          traverse(inst->object);
        }
      }